

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_test.c
# Opt level: O0

void test_wait_n_ready_while_queuing(testing t)

{
  nsync_time abs_deadline;
  int iVar1;
  nsync_note pnVar2;
  char *pcVar3;
  nsync_time abs_deadline_00;
  nsync_waitable_s **in_stack_ffffffffffffff50;
  testing t_00;
  nsync_note n_1;
  nsync_note n;
  nsync_waitable_funcs_s wrapped_note_waitable_funcs;
  int woken;
  int count;
  nsync_waitable_s *pw [2];
  nsync_waitable_s w [2];
  testing t_local;
  
  wrapped_note_waitable_funcs.ready_time = nsync::note_enqueue;
  wrapped_note_waitable_funcs.enqueue = nsync::note_dequeue;
  n = (nsync_note)note_ready_time_wrapper;
  for (wrapped_note_waitable_funcs.dequeue._4_4_ = 0; wrapped_note_waitable_funcs.dequeue._4_4_ != 2
      ; wrapped_note_waitable_funcs.dequeue._4_4_ = wrapped_note_waitable_funcs.dequeue._4_4_ + 1) {
    abs_deadline.tv_nsec = 999999999;
    abs_deadline.tv_sec = 0x7fffffffffffffff;
    pnVar2 = nsync::nsync_note_new((nsync_note)0x0,abs_deadline);
    iVar1 = nsync::nsync_note_is_notified(pnVar2);
    if (iVar1 != 0) {
      pcVar3 = smprintf("nsync_note is unexpectedly notified");
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/wait_test.c"
                     ,0xa0,pcVar3);
    }
    w[(long)wrapped_note_waitable_funcs.dequeue._4_4_ + -1].funcs = (nsync_waitable_funcs_s *)pnVar2
    ;
    w[wrapped_note_waitable_funcs.dequeue._4_4_].v = &n;
    *(nsync_waitable_funcs_s ***)(&woken + (long)wrapped_note_waitable_funcs.dequeue._4_4_ * 2) =
         &w[(long)wrapped_note_waitable_funcs.dequeue._4_4_ + -1].funcs;
  }
  abs_deadline_00.tv_nsec._0_4_ = 2;
  abs_deadline_00.tv_sec = 999999999;
  abs_deadline_00.tv_nsec._4_4_ = 0;
  wrapped_note_waitable_funcs.dequeue._0_4_ =
       nsync::nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x7fffffffffffffff,abs_deadline_00,(int)&woken,
                           in_stack_ffffffffffffff50);
  if ((int)wrapped_note_waitable_funcs.dequeue != 0) {
    pcVar3 = smprintf("nsync_wait_n unexpectedly failed to find pw[0] notified");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/wait_test.c"
                   ,0xa9,pcVar3);
  }
  for (wrapped_note_waitable_funcs.dequeue._4_4_ = 0; wrapped_note_waitable_funcs.dequeue._4_4_ != 2
      ; wrapped_note_waitable_funcs.dequeue._4_4_ = wrapped_note_waitable_funcs.dequeue._4_4_ + 1) {
    pnVar2 = (nsync_note)w[(long)wrapped_note_waitable_funcs.dequeue._4_4_ + -1].funcs;
    iVar1 = nsync::nsync_note_is_notified(pnVar2);
    if (iVar1 == 0) {
      t_00 = t;
      pcVar3 = smprintf("nsync_note is unexpectedly not notified");
      testing_error_(t_00,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/wait_test.c"
                     ,0xae,pcVar3);
    }
    nsync::nsync_note_free(pnVar2);
  }
  return;
}

Assistant:

static void test_wait_n_ready_while_queuing (testing t) {
	struct nsync_waitable_s w[2];
	struct nsync_waitable_s *pw[2];
	int count;
	int woken;

        /* This test works by wrapping nsync_note's *ready_time function so
           that the note is notified just after nsync_wait_n() checks that it
           if not notified on entry.  */
	struct nsync_waitable_funcs_s wrapped_note_waitable_funcs;
	wrapped_note_waitable_funcs = nsync_note_waitable_funcs;
	wrapped_note_waitable_funcs.ready_time = &note_ready_time_wrapper;

	for (count = 0; count != sizeof (w) / sizeof (w[0]); count++) {
		nsync_note n = nsync_note_new (NULL, nsync_time_no_deadline);
		if (nsync_note_is_notified (n)) {
			TEST_ERROR (t, ("nsync_note is unexpectedly notified"));
		}
		w[count].v = n;
		w[count].funcs = &wrapped_note_waitable_funcs;
		pw[count] = &w[count];
	}
	woken = nsync_wait_n (NULL, NULL, NULL, nsync_time_no_deadline,
			      count, pw);
	if (woken != 0) {
		TEST_ERROR (t, ("nsync_wait_n unexpectedly failed to find pw[0] notified"));
	}
	for (count = 0; count != sizeof (w) / sizeof (w[0]); count++) {
		nsync_note n = (nsync_note) w[count].v;
		if (!nsync_note_is_notified (n)) {
			TEST_ERROR (t, ("nsync_note is unexpectedly not notified"));
		}
		nsync_note_free (n);
	}
}